

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O3

bool tinyexr::CompressPiz
               (uchar *outPtr,uint *outSize,uchar *inPtr,size_t inSize,
               vector<tinyexr::ChannelInfo,_std::allocator<tinyexr::ChannelInfo>_> *channelInfo,
               int data_width,int num_lines)

{
  long *plVar1;
  uint uVar2;
  size_t __n;
  pointer raw;
  int i;
  uint uVar3;
  int iVar4;
  int iVar5;
  undefined8 uVar6;
  pointer pPVar7;
  long lVar8;
  pointer pPVar9;
  uint uVar10;
  long lVar11;
  short bs;
  ushort uVar12;
  uint uVar13;
  ulong uVar14;
  uint uVar15;
  uint uVar16;
  int iVar17;
  int *piVar18;
  ushort uVar19;
  uint uVar20;
  int *piVar21;
  ushort *puVar22;
  unsigned_short *puVar23;
  short as;
  int iVar24;
  ushort uVar25;
  uint uVar26;
  ushort *__dest;
  long lVar27;
  long lVar28;
  ushort *puVar29;
  uint uVar30;
  int iVar31;
  uint uVar32;
  bool bVar33;
  unsigned_short maxNonZero;
  unsigned_short minNonZero;
  int n;
  vector<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_> channelData;
  vector<unsigned_short,_std::allocator<unsigned_short>_> tmpBuffer;
  uchar bitmap [8192];
  unsigned_short lut [65536];
  ushort uStack_2214c;
  ushort uStack_2214a;
  ulong uStack_22148;
  long lStack_22140;
  uint uStack_22138;
  int iStack_22134;
  pointer pPStack_22130;
  long lStack_22128;
  long lStack_22120;
  long lStack_22118;
  ulong uStack_22110;
  uint uStack_22104;
  uint uStack_22100;
  int iStack_220fc;
  ushort *puStack_220f8;
  ushort *puStack_220f0;
  long lStack_220e8;
  ushort *puStack_220e0;
  ulong uStack_220d8;
  vector<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_> vStack_220d0;
  vector<unsigned_short,_std::allocator<unsigned_short>_> vStack_220b8;
  uchar *puStack_220a0;
  unsigned_short *puStack_22098;
  uint *puStack_22090;
  long lStack_22088;
  long lStack_22080;
  long lStack_22078;
  long lStack_22070;
  long lStack_22068;
  long lStack_22060;
  ushort *puStack_22058;
  long lStack_22050;
  ushort *puStack_22048;
  unsigned_short *puStack_22040;
  byte abStack_22038 [8192];
  allocator_type aaStack_20038 [131080];
  
  puStack_220f0 = (ushort *)outPtr;
  puStack_22090 = outSize;
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::vector
            (&vStack_220b8,inSize >> 1,aaStack_20038);
  std::vector<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>::vector
            (&vStack_220d0,
             ((long)(channelInfo->
                    super__Vector_base<tinyexr::ChannelInfo,_std::allocator<tinyexr::ChannelInfo>_>)
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(channelInfo->
                    super__Vector_base<tinyexr::ChannelInfo,_std::allocator<tinyexr::ChannelInfo>_>)
                    ._M_impl.super__Vector_impl_data._M_start >> 4) * -0x5555555555555555,
             (allocator_type *)aaStack_20038);
  if (vStack_220b8.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
      super__Vector_impl_data._M_finish ==
      vStack_220b8.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
      super__Vector_impl_data._M_start) {
    std::__throw_out_of_range_fmt
              ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",0,0);
  }
  else {
    if ((long)vStack_220d0.
              super__Vector_base<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>.
              _M_impl.super__Vector_impl_data._M_finish -
        (long)vStack_220d0.
              super__Vector_base<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>.
              _M_impl.super__Vector_impl_data._M_start != 0) {
      lVar8 = (long)vStack_220d0.
                    super__Vector_base<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)vStack_220d0.
                    super__Vector_base<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 5;
      lVar8 = lVar8 + (ulong)(lVar8 == 0);
      piVar21 = &(vStack_220d0.
                  super__Vector_base<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>
                  ._M_impl.super__Vector_impl_data._M_start)->size;
      piVar18 = &((channelInfo->
                  super__Vector_base<tinyexr::ChannelInfo,_std::allocator<tinyexr::ChannelInfo>_>).
                  _M_impl.super__Vector_impl_data._M_start)->pixel_type;
      puVar23 = vStack_220b8.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                _M_impl.super__Vector_impl_data._M_start;
      do {
        ((PIZChannelData *)(piVar21 + -7))->start = puVar23;
        *(unsigned_short **)(piVar21 + -5) = puVar23;
        piVar21[-3] = data_width;
        piVar21[-2] = num_lines;
        iVar5 = *piVar18;
        *piVar21 = (iVar5 != 1) + 1;
        puVar23 = puVar23 + (num_lines * data_width << (iVar5 != 1));
        piVar21 = piVar21 + 8;
        piVar18 = piVar18 + 0xc;
        lVar8 = lVar8 + -1;
      } while (lVar8 != 0);
    }
    pPStack_22130 =
         vStack_220d0.
         super__Vector_base<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>.
         _M_impl.super__Vector_impl_data._M_start;
    pPVar9 = vStack_220d0.
             super__Vector_base<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    if (0 < num_lines) {
      uVar14 = 0;
      do {
        bVar33 = pPVar9 != pPStack_22130;
        pPVar9 = pPStack_22130;
        uStack_22110 = uVar14;
        if (bVar33) {
          lVar8 = 8;
          uVar14 = 0;
          pPVar7 = pPStack_22130;
          do {
            lVar11 = (long)*(int *)((long)&pPVar7->ny + lVar8) *
                     (long)*(int *)((long)&pPVar7->end + lVar8);
            __n = lVar11 * 2;
            memcpy(*(void **)((long)&pPVar7->start + lVar8),inPtr,__n);
            inPtr = inPtr + lVar11 * 2;
            plVar1 = (long *)((long)&pPVar7->start + lVar8);
            *plVar1 = *plVar1 + __n;
            uVar14 = uVar14 + 1;
            lVar8 = lVar8 + 0x20;
            pPVar7 = vStack_220d0.
                     super__Vector_base<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            pPStack_22130 =
                 vStack_220d0.
                 super__Vector_base<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>
                 ._M_impl.super__Vector_impl_data._M_start;
            pPVar9 = vStack_220d0.
                     super__Vector_base<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
          } while (uVar14 < (ulong)((long)vStack_220d0.
                                          super__Vector_base<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                    (long)vStack_220d0.
                                          super__Vector_base<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>
                                          ._M_impl.super__Vector_impl_data._M_start >> 5));
        }
        uVar15 = (int)uStack_22110 + 1;
        uVar14 = (ulong)uVar15;
      } while (uVar15 != num_lines);
    }
    raw = vStack_220b8.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
          super__Vector_impl_data._M_start;
    inPtr = (uchar *)((long)vStack_220b8.
                            super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                            _M_impl.super__Vector_impl_data._M_finish -
                      (long)vStack_220b8.
                            super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                            _M_impl.super__Vector_impl_data._M_start >> 1);
    if (vStack_220b8.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        vStack_220b8.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
        super__Vector_impl_data._M_start) {
      uVar15 = (uint)inPtr;
      bitmapFromData(vStack_220b8.
                     super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                     super__Vector_impl_data._M_start,uVar15,abStack_22038,&uStack_2214a,
                     &uStack_2214c);
      uVar14 = 0;
      uStack_22148 = 0;
      do {
        if ((uVar14 == 0) ||
           ((abStack_22038[uVar14 >> 3 & 0x1fffffff] >> ((uint)uVar14 & 7) & 1) != 0)) {
          iVar5 = (int)uStack_22148;
          uStack_22148 = (ulong)(iVar5 + 1);
        }
        else {
          iVar5 = 0;
        }
        *(short *)(aaStack_20038 + uVar14 * 2) = (short)iVar5;
        uVar14 = uVar14 + 1;
      } while (uVar14 != 0x10000);
      if (0 < (int)uVar15) {
        uVar14 = 0;
        do {
          raw[uVar14] = *(unsigned_short *)(aaStack_20038 + (ulong)raw[uVar14] * 2);
          uVar14 = uVar14 + 1;
        } while ((uVar15 & 0x7fffffff) != uVar14);
      }
      *puStack_220f0 = uStack_2214a;
      puStack_220f0[1] = uStack_2214c;
      __dest = puStack_220f0 + 2;
      if (uStack_2214a <= uStack_2214c) {
        lVar8 = (ulong)uStack_2214c - (ulong)uStack_2214a;
        memcpy(__dest,abStack_22038 + uStack_2214a,lVar8 + 1);
        __dest = (ushort *)((long)__dest + lVar8 + 1);
      }
      puStack_22098 = raw;
      if ((long)pPVar9 - (long)pPStack_22130 != 0) {
        uVar3 = (int)uStack_22148 - 1;
        uStack_22148 = (ulong)uVar3;
        lStack_22088 = (long)pPVar9 - (long)pPStack_22130 >> 5;
        lStack_22088 = lStack_22088 + (ulong)(lStack_22088 == 0);
        lVar8 = 0;
        do {
          lStack_22080 = lVar8;
          iVar5 = pPStack_22130[lStack_22080].size;
          lStack_22140 = (long)iVar5;
          if (0 < lStack_22140) {
            pPVar9 = pPStack_22130 + lStack_22080;
            puStack_22040 = pPVar9->start;
            uVar2 = pPVar9->nx;
            uStack_22104 = pPVar9->ny;
            iStack_22134 = uVar2 * iVar5;
            uStack_22138 = uStack_22104;
            if ((int)uVar2 < (int)uStack_22104) {
              uStack_22138 = uVar2;
            }
            lStack_220e8 = 0;
            lStack_22120 = 0;
            do {
              if (1 < (int)uStack_22138) {
                puStack_220e0 = puStack_22040 + lStack_22120;
                uVar14 = 2;
                uVar30 = 1;
                do {
                  uStack_220d8 = uVar14;
                  uVar16 = (uint)uStack_220d8;
                  iVar4 = (uStack_22104 - uVar16) * iStack_22134;
                  lStack_22118 = (long)(int)(uVar30 * iVar5);
                  lVar8 = (long)(int)(uVar16 * iVar5);
                  uVar10 = uVar3 & 0xffff;
                  puVar29 = puStack_220e0;
                  if (-1 < iVar4) {
                    puStack_22058 = puStack_220e0 + iVar4;
                    iStack_220fc = (uVar2 - uVar16) * iVar5;
                    lStack_22070 = (long)iStack_220fc;
                    lStack_22078 = (long)(int)(uVar30 * iStack_22134);
                    lStack_22060 = (long)(int)(uVar16 * iStack_22134);
                    lStack_22068 = lStack_22060 * 2;
                    uStack_22110 = lVar8 * 2;
                    lVar11 = lStack_22118 * 2 + lStack_22078 * 2;
                    lVar27 = lStack_220e8;
                    do {
                      puVar22 = puVar29;
                      if (-1 < iStack_220fc) {
                        lVar28 = lVar27;
                        do {
                          uVar12 = *(ushort *)((long)puStack_22040 + lVar28);
                          uVar25 = *(ushort *)((long)puStack_22040 + lVar28 + lStack_22118 * 2);
                          if (uVar10 < 0x4000) {
                            iVar17 = (int)(short)uVar12 - (int)(short)uVar25;
                            iVar24 = (int)*(short *)((long)puStack_22040 + lVar28 + lStack_22078 * 2
                                                    );
                            iVar4 = (int)*(short *)((long)puStack_22040 + lVar28 + lVar11);
                            iVar31 = iVar24 - iVar4;
                            uVar26 = (int)(short)uVar25 + (int)(short)uVar12;
                            uVar13 = iVar4 + iVar24;
                            iVar4 = (uVar26 >> 1) - (uVar13 >> 1);
                            uVar12 = (ushort)((uint)(((int)uVar13 >> 1) + ((int)uVar26 >> 1)) >> 1);
                            uVar25 = (ushort)((uint)((int)(short)iVar31 + (int)(short)iVar17) >> 1);
                            iVar17 = iVar17 - iVar31;
                          }
                          else {
                            uVar20 = (uVar12 ^ 0x8000) - (uint)uVar25;
                            uVar32 = (uint)*(ushort *)((long)puStack_22040 + lVar28 + lVar11);
                            uVar13 = *(ushort *)((long)puStack_22040 + lVar28 + lStack_22078 * 2) ^
                                     0x8000;
                            uVar26 = uVar13 - uVar32;
                            uVar32 = uVar26 >> 0x10 & 0x8000 ^ uVar13 + uVar32 >> 1;
                            uVar13 = (uVar12 ^ 0x8000) + (uint)uVar25 >> 1 ^ 0x8000 ^
                                     uVar20 >> 0x10 & 0x8000;
                            iVar4 = uVar13 - uVar32;
                            uVar12 = (ushort)((uint)iVar4 >> 0x10) & 0x8000 ^
                                     (ushort)(uVar32 + uVar13 >> 1);
                            uVar13 = uVar20 & 0xffff ^ 0x8000;
                            uVar26 = uVar26 & 0xffff;
                            iVar17 = uVar13 - uVar26;
                            uVar25 = (ushort)((uint)iVar17 >> 0x10) & 0x8000 ^
                                     (ushort)(uVar26 + uVar13 >> 1);
                          }
                          *(ushort *)((long)puStack_22040 + lVar28) = uVar12;
                          *(short *)((long)puStack_22040 + lVar28 + lStack_22078 * 2) = (short)iVar4
                          ;
                          *(ushort *)((long)puStack_22040 + lVar28 + lStack_22118 * 2) = uVar25;
                          *(short *)((long)puStack_22040 + lVar28 + lVar11) = (short)iVar17;
                          lVar28 = lVar28 + uStack_22110;
                          puVar22 = (ushort *)((long)puStack_22040 + lVar28);
                          lStack_22050 = lVar27;
                          puStack_22048 = puVar29;
                        } while (puVar22 <= puVar29 + lStack_22070);
                      }
                      if ((uVar2 & uVar30) != 0) {
                        uVar12 = *puVar22;
                        uVar25 = puVar22[lStack_22078];
                        if (uVar10 < 0x4000) {
                          uVar19 = (ushort)((uint)((int)(short)uVar25 + (int)(short)uVar12) >> 1);
                          iVar4 = (int)(short)uVar12 - (int)(short)uVar25;
                        }
                        else {
                          iVar4 = (uVar12 ^ 0x8000) - (uint)uVar25;
                          uVar19 = (ushort)((uint)iVar4 >> 0x10) & 0x8000 ^
                                   (ushort)((uVar12 ^ 0x8000) + (uint)uVar25 >> 1);
                        }
                        puVar22[lStack_22078] = (ushort)iVar4;
                        *puVar22 = uVar19;
                      }
                      puVar29 = puVar29 + lStack_22060;
                      lVar27 = lVar27 + lStack_22068;
                      uStack_22100 = uVar30;
                    } while (puVar29 <= puStack_22058);
                  }
                  lStack_22128 = lVar8;
                  if (((uVar30 & uStack_22104) != 0) &&
                     (iVar4 = (uVar2 - uVar16) * iVar5, -1 < iVar4)) {
                    puVar22 = puVar29 + iVar4;
                    lStack_22128 = lVar8 * 2;
                    do {
                      uVar12 = *puVar29;
                      uVar25 = puVar29[lStack_22118];
                      if (uVar10 < 0x4000) {
                        uVar19 = (ushort)((uint)((int)(short)uVar25 + (int)(short)uVar12) >> 1);
                        iVar4 = (int)(short)uVar12 - (int)(short)uVar25;
                      }
                      else {
                        iVar4 = (uVar12 ^ 0x8000) - (uint)uVar25;
                        uVar19 = (ushort)((uint)iVar4 >> 0x10) & 0x8000 ^
                                 (ushort)((uVar12 ^ 0x8000) + (uint)uVar25 >> 1);
                      }
                      puVar29[lStack_22118] = (ushort)iVar4;
                      *puVar29 = uVar19;
                      puVar29 = puVar29 + lVar8;
                    } while (puVar29 <= puVar22);
                  }
                  uVar14 = (ulong)(uVar16 * 2);
                  uVar30 = uVar16;
                } while ((int)(uVar16 * 2) <= (int)uStack_22138);
              }
              lStack_22120 = lStack_22120 + 1;
              lStack_220e8 = lStack_220e8 + 2;
            } while (lStack_22120 != lStack_22140);
          }
          lVar8 = lStack_22080 + 1;
        } while (lStack_22080 + 1 != lStack_22088);
      }
      __dest[0] = 0;
      __dest[1] = 0;
      puStack_220f8 = __dest;
      puStack_220a0 = inPtr;
      iVar5 = hufCompress(raw,uVar15,(char *)(__dest + 2));
      *(int *)__dest = iVar5;
      *puStack_22090 = ((int)(__dest + 2) - (int)puStack_220f0) + iVar5;
      if (vStack_220d0.
          super__Vector_base<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(vStack_220d0.
                        super__Vector_base<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)vStack_220d0.
                              super__Vector_base<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)vStack_220d0.
                              super__Vector_base<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      if (vStack_220b8.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
          super__Vector_impl_data._M_start != (unsigned_short *)0x0) {
        operator_delete(vStack_220b8.
                        super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)vStack_220b8.
                              super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)vStack_220b8.
                              super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      return true;
    }
  }
  uVar6 = std::__throw_out_of_range_fmt
                    ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",0,
                     inPtr);
  if (vStack_220d0.
      super__Vector_base<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(vStack_220d0.
                    super__Vector_base<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)vStack_220d0.
                          super__Vector_base<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)vStack_220d0.
                          super__Vector_base<tinyexr::PIZChannelData,_std::allocator<tinyexr::PIZChannelData>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (vStack_220b8.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
      super__Vector_impl_data._M_start != (unsigned_short *)0x0) {
    operator_delete(vStack_220b8.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)vStack_220b8.
                          super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)vStack_220b8.
                          super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  _Unwind_Resume(uVar6);
}

Assistant:

bool CompressPiz(unsigned char *outPtr, unsigned int &outSize,
                 const unsigned char *inPtr, size_t inSize,
                 const std::vector<ChannelInfo> &channelInfo, int data_width,
                 int num_lines) {
  unsigned char bitmap[BITMAP_SIZE];
  unsigned short minNonZero;
  unsigned short maxNonZero;

#if !MINIZ_LITTLE_ENDIAN
  // @todo { PIZ compression on BigEndian architecture. }
  assert(0);
  return false;
#endif

  // Assume `inSize` is multiple of 2 or 4.
  std::vector<unsigned short> tmpBuffer(inSize / sizeof(unsigned short));

  std::vector<PIZChannelData> channelData(channelInfo.size());
  unsigned short *tmpBufferEnd = &tmpBuffer.at(0);

  for (size_t c = 0; c < channelData.size(); c++) {
    PIZChannelData &cd = channelData[c];

    cd.start = tmpBufferEnd;
    cd.end = cd.start;

    cd.nx = data_width;
    cd.ny = num_lines;
    // cd.ys = c.channel().ySampling;

    int pixelSize = sizeof(int);  // UINT and FLOAT
    if (channelInfo[c].pixel_type == TINYEXR_PIXELTYPE_HALF) {
      pixelSize = sizeof(short);
    }

    cd.size = pixelSize / sizeof(short);

    tmpBufferEnd += cd.nx * cd.ny * cd.size;
  }

  const unsigned char *ptr = inPtr;
  for (int y = 0; y < num_lines; ++y) {
    for (size_t i = 0; i < channelData.size(); ++i) {
      PIZChannelData &cd = channelData[i];

      // if (modp (y, cd.ys) != 0)
      //    continue;

      int n = cd.nx * cd.size;
      memcpy(cd.end, ptr, n * sizeof(unsigned short));
      ptr += n * sizeof(unsigned short);
      cd.end += n;
    }
  }

  bitmapFromData(&tmpBuffer.at(0), tmpBuffer.size(), bitmap, minNonZero,
                 maxNonZero);

  unsigned short lut[USHORT_RANGE];
  unsigned short maxValue = forwardLutFromBitmap(bitmap, lut);
  applyLut(lut, &tmpBuffer.at(0), tmpBuffer.size());

  //
  // Store range compression info in _outBuffer
  //

  char *buf = reinterpret_cast<char *>(outPtr);

  memcpy(buf, &minNonZero, sizeof(unsigned short));
  buf += sizeof(unsigned short);
  memcpy(buf, &maxNonZero, sizeof(unsigned short));
  buf += sizeof(unsigned short);

  if (minNonZero <= maxNonZero) {
    memcpy(buf, (char *)&bitmap[0] + minNonZero, maxNonZero - minNonZero + 1);
    buf += maxNonZero - minNonZero + 1;
  }

  //
  // Apply wavelet encoding
  //

  for (size_t i = 0; i < channelData.size(); ++i) {
    PIZChannelData &cd = channelData[i];

    for (int j = 0; j < cd.size; ++j) {
      wav2Encode(cd.start + j, cd.nx, cd.size, cd.ny, cd.nx * cd.size,
                 maxValue);
    }
  }

  //
  // Apply Huffman encoding; append the result to _outBuffer
  //

  // length header(4byte), then huff data. Initialize length header with zero,
  // then later fill it by `length`.
  char *lengthPtr = buf;
  int zero = 0;
  memcpy(buf, &zero, sizeof(int));
  buf += sizeof(int);

  int length = hufCompress(&tmpBuffer.at(0), tmpBuffer.size(), buf);
  memcpy(lengthPtr, &length, sizeof(int));

  outSize = (reinterpret_cast<unsigned char *>(buf) - outPtr) + length;
  return true;
}